

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

void __thiscall Builder::~Builder(Builder *this)

{
  CommandRunner *pCVar1;
  
  Cleanup(this);
  std::
  _Rb_tree<const_Edge_*,_std::pair<const_Edge_*const,_int>,_std::_Select1st<std::pair<const_Edge_*const,_int>_>,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
  ::~_Rb_tree(&(this->running_edges_)._M_t);
  pCVar1 = (this->command_runner_)._M_t.
           super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
           super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
  if (pCVar1 != (CommandRunner *)0x0) {
    (*pCVar1->_vptr_CommandRunner[1])();
  }
  (this->command_runner_)._M_t.
  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = (CommandRunner *)0x0;
  std::_Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_EdgeCmp,_std::allocator<Edge_*>_>::~_Rb_tree
            (&(this->plan_).ready_._M_t);
  std::
  _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
  ::~_Rb_tree((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
               *)&this->plan_);
  return;
}

Assistant:

Builder::~Builder() {
  Cleanup();
}